

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O3

int Gia_ManGraphToAig(Gia_Man_t *p,Dec_Graph_t *pGraph)

{
  Dec_Node_t *pDVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  
  if (pGraph->fConst == 0) {
    uVar5 = (ulong)(uint)pGraph->nLeaves;
    uVar3 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
    if (uVar3 < (uint)pGraph->nLeaves) {
      uVar2 = pGraph->pNodes[uVar3].field_2.iFunc;
      if ((int)uVar2 < 0) {
LAB_006e6b0d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      uVar3 = (uint)pGraph->eRoot & 1;
    }
    else {
      lVar4 = uVar5 * 0x18 + 8;
      do {
        pDVar1 = pGraph->pNodes;
        uVar3 = *(uint *)((long)pDVar1 + lVar4 + -8);
        if (pDVar1[uVar3 >> 1 & 0x3fffffff].field_2.iFunc < 0) goto LAB_006e6b0d;
        uVar2 = *(uint *)((long)pDVar1 + lVar4 + -4);
        if (pDVar1[uVar2 >> 1 & 0x3fffffff].field_2.iFunc < 0) goto LAB_006e6b0d;
        uVar3 = Gia_ManHashAnd(p,uVar3 & 1 ^ pDVar1[uVar3 >> 1 & 0x3fffffff].field_2.iFunc,
                               uVar2 & 1 ^ pDVar1[uVar2 >> 1 & 0x3fffffff].field_2.iFunc);
        *(uint *)(&(pDVar1->eEdge0).field_0x0 + lVar4) = uVar3;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x18;
      } while ((long)uVar5 < (long)pGraph->nSize);
      if ((int)uVar3 < 0) goto LAB_006e6b0d;
      uVar2 = (uint)pGraph->eRoot & 1;
    }
    uVar2 = uVar2 ^ uVar3;
  }
  else {
    uVar2 = ~(uint)pGraph->eRoot & 1;
  }
  return uVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create GIA for SOP.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManGraphToAig( Gia_Man_t * p, Dec_Graph_t * pGraph )
{
    Dec_Node_t * pNode = NULL; // Suppress "might be used uninitialized"
    int i, iAnd0, iAnd1;
    // check for constant function
    if ( Dec_GraphIsConst(pGraph) )
        return Abc_LitNotCond( 1, Dec_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Dec_GraphIsVar(pGraph) )
        return Abc_LitNotCond( Dec_GraphVar(pGraph)->iFunc, Dec_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Dec_GraphForEachNode( pGraph, pNode, i )
    {
        iAnd0 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge0.Node)->iFunc, pNode->eEdge0.fCompl ); 
        iAnd1 = Abc_LitNotCond( Dec_GraphNode(pGraph, pNode->eEdge1.Node)->iFunc, pNode->eEdge1.fCompl ); 
        pNode->iFunc = Gia_ManHashAnd( p, iAnd0, iAnd1 );
    }
    // complement the result if necessary
    return Abc_LitNotCond( pNode->iFunc, Dec_GraphIsComplement(pGraph) );
}